

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O0

Fossilize * __thiscall
Fossilize::extract_string_abi_cxx11_(Fossilize *this,uint32_t *words,uint32_t num_words)

{
  uint local_2c;
  uint32_t uStack_28;
  char c;
  uint32_t j;
  uint32_t w;
  uint32_t i;
  uint32_t num_words_local;
  uint32_t *words_local;
  string *ret;
  
  std::__cxx11::string::string((string *)this);
  j = 0;
  do {
    if (num_words <= j) {
      return this;
    }
    uStack_28 = words[j];
    for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
      if ((char)uStack_28 == '\0') {
        return this;
      }
      std::__cxx11::string::operator+=((string *)this,(char)uStack_28);
      uStack_28 = uStack_28 >> 8;
    }
    j = j + 1;
  } while( true );
}

Assistant:

static std::string extract_string(const uint32_t *words, uint32_t num_words)
{
	std::string ret;
	for (uint32_t i = 0; i < num_words; i++)
	{
		uint32_t w = words[i];

		for (uint32_t j = 0; j < 4; j++, w >>= 8)
		{
			auto c = char(w & 0xff);
			if (c == '\0')
				return ret;
			ret += c;
		}
	}
	return ret;
}